

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cc
# Opt level: O3

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
t_container::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_container *this)

{
  t_slot *ptVar1;
  t_object *ptVar2;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  __pointer_type ptVar3;
  t_object *ptVar4;
  undefined8 *puVar5;
  t_object *local_70;
  t_container *local_68;
  vector<xemmai::t_root,_std::allocator<xemmai::t_root>_> local_60;
  pointer ppStack_48;
  pointer local_40;
  pointer ppStack_38;
  t_value<xemmai::t_pointer> local_30;
  
  ptVar4 = xemmai::t_type_of<t_pair>::f_define(this);
  (this->v_type_pair).v_p = (t_type_of<xemmai::t_object> *)ptVar4->v_data;
  if ((t_object *)0x4 < ptVar4) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_0010fe08);
    this_00 = (t_queue<128UL> *)*puVar5;
    *this_00->v_head = ptVar4;
    if (this_00->v_head == this_00->v_next) {
      xemmai::t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = &(this->v_type_pair).v_slot;
  ptVar2 = (ptVar1->v_p)._M_b._M_p;
  (ptVar1->v_p)._M_b._M_p = ptVar4;
  UNLOCK();
  if ((t_object *)0x4 < ptVar2) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_0010fe40);
    this_01 = (t_queue<256UL> *)*puVar5;
    *this_01->v_head = ptVar2;
    if (this_01->v_head == this_01->v_next) {
      xemmai::t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  xemmai::t_type_of<t_queue>::f_define(this);
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppStack_38 = (pointer)0x0;
  ptVar3 = (this->v_type_queue).v_slot.v_p._M_b._M_p;
  local_68 = this;
  local_70 = (t_object *)xemmai::t_symbol::f_instantiate(5,L"Queue");
  local_30.super_t_pointer.v_p = ptVar3;
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_value<xemmai::t_pointer>>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&ppStack_48,&local_70,&local_30);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = ppStack_48;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = local_40;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = ppStack_38;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppStack_38 = (pointer)0x0;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)&ppStack_48);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_container::f_define()
{
	v_type_pair.f_construct(t_type_of<t_pair>::f_define(this));
	t_type_of<t_queue>::f_define(this);
	return t_define(this)
	(L"Queue"sv, static_cast<t_object*>(v_type_queue))
	;
}